

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdrag.cpp
# Opt level: O2

QDrag * __thiscall QPlatformDrag::currentDrag(QPlatformDrag *this)

{
  QDragManager *pQVar1;
  QObject *pQVar2;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QDragManager::self();
  local_20.d = (pQVar1->m_object).wp.d;
  local_20.value = (pQVar1->m_object).wp.value;
  if (local_20.d != (Data *)0x0) {
    LOCK();
    ((local_20.d)->weakref)._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if ((local_20.d != (Data *)0x0) &&
       (pQVar2 = local_20.value,
       ((local_20.d)->strongref)._q_value.super___atomic_base<int>._M_i != 0)) goto LAB_00505efe;
  }
  pQVar2 = (QObject *)0x0;
LAB_00505efe:
  QWeakPointer<QObject>::~QWeakPointer(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (QDrag *)pQVar2;
}

Assistant:

QDrag *QPlatformDrag::currentDrag() const
{
    return QDragManager::self()->object();
}